

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImU32 IVar6;
  float fVar7;
  float fVar8;
  bool held;
  bool hovered;
  ImRect bb;
  bool local_62;
  bool local_61;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  undefined1 local_48 [16];
  ImRect local_38;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  IVar1 = (GImGui->Style).FramePadding;
  fVar7 = IVar1.x;
  fVar8 = IVar1.y;
  local_38.Max.x = fVar7 + fVar7 + GImGui->FontSize + (*pos).x;
  local_38.Max.y = fVar8 + fVar8 + GImGui->FontSize + (*pos).y;
  local_38.Min = *pos;
  bVar4 = ItemAdd(&local_38,id,(ImRect *)0x0);
  bVar5 = ButtonBehavior(&local_38,id,&local_61,&local_62,0);
  if (bVar4) {
    IVar6 = GetColorU32(local_62 | 0x16,1.0);
    local_60.x = (local_38.Max.x + local_38.Min.x) * 0.5;
    local_60.y = (local_38.Max.y + local_38.Min.y) * 0.5;
    if (local_61 == true) {
      fVar8 = pIVar3->FontSize * 0.5 + 1.0;
      fVar7 = 2.0;
      if (2.0 <= fVar8) {
        fVar7 = fVar8;
      }
      ImDrawList::AddCircleFilled(pIVar2->DrawList,&local_60,fVar7,IVar6,0xc);
    }
    local_48 = ZEXT416((uint)(pIVar3->FontSize * 0.5 * 0.7071 + -1.0));
    IVar6 = GetColorU32(0,1.0);
    local_60.x = local_60.x + -0.5;
    local_60.y = local_60.y + -0.5;
    local_50.y = (float)local_48._0_4_ + local_60.y;
    local_50.x = (float)local_48._0_4_ + local_60.x;
    local_58.y = local_60.y - (float)local_48._0_4_;
    local_58.x = local_60.x - (float)local_48._0_4_;
    ImDrawList::AddLine(pIVar2->DrawList,&local_50,&local_58,IVar6,1.0);
    local_50.y = local_60.y - (float)local_48._0_4_;
    local_50.x = (float)local_48._0_4_ + local_60.x;
    local_58.y = (float)local_48._0_4_ + local_60.y;
    local_58.x = local_60.x - (float)local_48._0_4_;
    ImDrawList::AddLine(pIVar2->DrawList,&local_50,&local_58,IVar6,1.0);
  }
  return bVar5;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos)//, float size)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We intentionally allow interaction when clipped so that a mechanical Alt,Right,Validate sequence close a window.
    // (this isn't the regular behavior of buttons, but it doesn't affect the user much because navigation tends to keep items visible).
    const ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    bool is_clipped = !ItemAdd(bb, id);

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    if (is_clipped)
        return pressed;

    // Render
    ImU32 col = GetColorU32(held ? ImGuiCol_ButtonActive : ImGuiCol_ButtonHovered);
    ImVec2 center = bb.GetCenter();
    if (hovered)
        window->DrawList->AddCircleFilled(center, ImMax(2.0f, g.FontSize * 0.5f + 1.0f), col, 12);

    float cross_extent = g.FontSize * 0.5f * 0.7071f - 1.0f;
    ImU32 cross_col = GetColorU32(ImGuiCol_Text);
    center -= ImVec2(0.5f, 0.5f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent,+cross_extent), center + ImVec2(-cross_extent,-cross_extent), cross_col, 1.0f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent,-cross_extent), center + ImVec2(-cross_extent,+cross_extent), cross_col, 1.0f);

    return pressed;
}